

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GLCoverageExtensionSpecificEnumsAreRecognizedTest::iterate
          (GLCoverageExtensionSpecificEnumsAreRecognizedTest *this)

{
  undefined4 uVar1;
  uint uVar2;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *pGVar3;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *pGVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar9;
  float fVar10;
  float fVar11;
  GLint int_value;
  GLboolean bool_value_1;
  GLboolean bool_value;
  undefined3 uStack_1bb;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *local_1b8;
  GLfloat float_value;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar8;
  
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_storage_multisample_2d_array_supported = bVar5;
  local_1b8 = this;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
    uVar1 = *(undefined4 *)((long)&DAT_0176e610 + lVar9);
    int_value = -1;
    (**(code **)(lVar8 + 0x868))(uVar1,&int_value);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetIntegerv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x6b);
    if (int_value < 1) {
      _float_value = ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"An invalid integer value ");
      std::ostream::operator<<(local_1a8,int_value);
      std::operator<<((ostream *)local_1a8," was reported for pname [");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8,"].");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&float_value,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid integer value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x72);
      goto LAB_00c8f100;
    }
    bool_value_1 = '\x01';
    (**(code **)(lVar8 + 0x798))(uVar1,&bool_value_1);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetBooleanv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x79);
    if ((int_value != 0 && bool_value_1 == '\0') || (bool_value_1 != '\0' && int_value == 0)) {
      _float_value = ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"An invalid boolean value [");
      std::operator<<((ostream *)local_1a8,bool_value_1);
      std::operator<<((ostream *)local_1a8,"]");
      std::operator<<((ostream *)local_1a8," was reported for pname [");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8,"]");
      std::operator<<((ostream *)local_1a8," (integer value reported for the same property:");
      std::ostream::operator<<(local_1a8,int_value);
      std::operator<<((ostream *)local_1a8,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&float_value,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid boolean value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x82);
      goto LAB_00c8f100;
    }
    _bool_value = -1.0;
    (**(code **)(lVar8 + 0x818))(uVar1,&bool_value);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetFloatv() reported an error for a valid pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x89);
    fVar11 = _bool_value - (float)int_value;
    fVar10 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar10 = fVar11;
    }
    if (1e-05 < fVar10) {
      _float_value = ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"An invalid floating-point value [");
      std::ostream::operator<<(local_1a8,_bool_value);
      std::operator<<((ostream *)local_1a8,"]");
      std::operator<<((ostream *)local_1a8," was reported for pname        [");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8,"]");
      std::operator<<((ostream *)local_1a8," (integer value reported for the same property:");
      std::ostream::operator<<(local_1a8,int_value);
      std::operator<<((ostream *)local_1a8,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&float_value,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid floating-point value reported for pname.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x92);
      goto LAB_00c8f100;
    }
  }
  _bool_value = (float)CONCAT31(uStack_1bb,1);
  _float_value = (TestLog *)CONCAT44(uStack_1ac,0x3f800000);
  int_value = 1;
  (**(code **)(lVar8 + 0x798))(0x9104,&bool_value);
  (**(code **)(lVar8 + 0x818))(0x9104,&float_value);
  (**(code **)(lVar8 + 0x868))(0x9104,&int_value);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,
                  "GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0xa1);
  pGVar3 = local_1b8;
  if (bool_value == '\0') {
    fVar10 = -float_value;
    if (-float_value <= float_value) {
      fVar10 = float_value;
    }
    if ((fVar10 <= 1e-05) && (int_value == 0)) {
      if (local_1b8->gl_oes_texture_storage_multisample_2d_array_supported == '\0') {
LAB_00c8ebc5:
        (**(code **)(lVar8 + 0x6f8))(1,&pGVar3->to_id_2d_multisample);
        if (pGVar3->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
          (**(code **)(lVar8 + 0x6f8))(1,&pGVar3->to_id_2d_multisample_array);
        }
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glGenTextures() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xc6);
        (**(code **)(lVar8 + 0xb8))(0x9100,pGVar3->to_id_2d_multisample);
        if (pGVar3->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
          (**(code **)(lVar8 + 0xb8))(0x9102,pGVar3->to_id_2d_multisample_array);
        }
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glBindTexture() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xd0);
        _bool_value = (float)((uint)_bool_value & 0xffffff00);
        _float_value = (TestLog *)((ulong)_float_value & 0xffffffff00000000);
        int_value = 0;
        (**(code **)(lVar8 + 0x798))(0x9104,&bool_value);
        (**(code **)(lVar8 + 0x818))(0x9104,&float_value);
        (**(code **)(lVar8 + 0x868))(0x9104,&int_value);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,
                        "GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xdc);
        pGVar4 = local_1b8;
        if (bool_value == '\x01') {
          uVar2 = pGVar3->to_id_2d_multisample;
          fVar11 = float_value - (float)uVar2;
          fVar10 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar10 = fVar11;
          }
          if ((fVar10 <= 1e-05) && (int_value == uVar2)) {
            if (local_1b8->gl_oes_texture_storage_multisample_2d_array_supported == '\0') {
LAB_00c8edc2:
              tcu::TestContext::setTestResult
                        ((pGVar4->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_PASS,"Pass");
              return STOP;
            }
            _bool_value = (float)((uint)_bool_value & 0xffffff00);
            _float_value = (TestLog *)((ulong)_float_value & 0xffffffff00000000);
            int_value = 0;
            (**(code **)(lVar8 + 0x798))(0x9105,&bool_value);
            (**(code **)(lVar8 + 0x818))(0x9105,&float_value);
            (**(code **)(lVar8 + 0x868))(0x9105,&int_value);
            dVar7 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar7,
                            "GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                            ,0xf2);
            if (bool_value == '\x01') {
              uVar2 = pGVar4->to_id_2d_multisample_array;
              fVar11 = float_value - (float)uVar2;
              fVar10 = -fVar11;
              if (-fVar11 <= fVar11) {
                fVar10 = fVar11;
              }
              if ((fVar10 <= 1e-05) && (int_value == uVar2)) goto LAB_00c8edc2;
            }
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid",
                       (char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                       ,0xf9);
            goto LAB_00c8f100;
          }
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                   ,0xe3);
      }
      else {
        _bool_value = (float)CONCAT31(uStack_1bb,1);
        _float_value = (TestLog *)CONCAT44(uStack_1ac,0x3f800000);
        int_value = 1;
        (**(code **)(lVar8 + 0x798))(0x9105,&bool_value);
        (**(code **)(lVar8 + 0x818))(0x9105,&float_value);
        (**(code **)(lVar8 + 0x868))(0x9105,&int_value);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,
                        "GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0xb4);
        if (bool_value == '\0') {
          fVar10 = -float_value;
          if (-float_value <= float_value) {
            fVar10 = float_value;
          }
          if ((fVar10 <= 1e-05) && (int_value == 0)) goto LAB_00c8ebc5;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Default GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                   ,0xb8);
      }
      goto LAB_00c8f100;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Default GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
             ,0xa5);
LAB_00c8f100:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GLCoverageExtensionSpecificEnumsAreRecognizedTest::iterate()
{
	gl_oes_texture_storage_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate through all pnames that need to be verified */
	const glw::GLenum pnames[] = { GL_MAX_SAMPLE_MASK_WORDS, GL_MAX_COLOR_TEXTURE_SAMPLES, GL_MAX_DEPTH_TEXTURE_SAMPLES,
								   GL_MAX_INTEGER_SAMPLES };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		const float epsilon = (float)1e-5;
		glw::GLenum pname   = pnames[n_pname];

		/* Test glGetIntegerv() */
		glw::GLint int_value = -1;

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error for a valid pname");

		if (int_value < 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid integer value " << int_value
							   << " was reported for pname [" << pname << "]." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid integer value reported for pname.");
		}

		/* Test glGetBooleanv() */
		glw::GLboolean bool_value = GL_TRUE;

		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error for a valid pname");

		if ((int_value != 0 && bool_value == GL_FALSE) || (int_value == 0 && bool_value != GL_FALSE))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid boolean value [" << bool_value << "]"
							   << " was reported for pname [" << pname << "]"
							   << " (integer value reported for the same property:" << int_value << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid boolean value reported for pname.");
		}

		/* Test glGetFloatv() */
		glw::GLfloat float_value = -1.0f;

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error for a valid pname");

		if (de::abs(float_value - float(int_value)) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "An invalid floating-point value [" << float_value << "]"
							   << " was reported for pname        [" << pname << "]"
							   << " (integer value reported for the same property:" << int_value << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid floating-point value reported for pname.");
		}
	} /* for (all pnames) */

	/* Verify default multisample texture bindings are valid */
	glw::GLboolean bool_value  = GL_TRUE;
	const float	epsilon	 = (float)1e-5;
	glw::GLfloat   float_value = 1.0f;
	glw::GLint	 int_value   = 1;

	gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &bool_value);
	gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &float_value);
	gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions");

	if (bool_value != GL_FALSE || de::abs(float_value) > epsilon || int_value != 0)
	{
		TCU_FAIL("Default GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		bool_value  = GL_TRUE;
		float_value = 1.0f;
		int_value   = 1;

		gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &bool_value);
		gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &float_value);
		gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &int_value);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions");

		if (bool_value != GL_FALSE || de::abs(float_value) > epsilon || int_value != 0)
		{
			TCU_FAIL("Default GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid");
		}
	}

	/* Generate two texture objects we will later bind to multisample texture targets to
	 * verify the values reported for corresponding pnames have also changed.
	 */
	gl.genTextures(1, &to_id_2d_multisample);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		gl.genTextures(1, &to_id_2d_multisample_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

	/* Now bind the IDs to relevant texture targets */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_2d_multisample);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_multisample_array);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed");

	/* Verify new bindings are reported */
	bool_value  = GL_FALSE;
	float_value = 0.0f;
	int_value   = 0;

	gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &bool_value);
	gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &float_value);
	gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"GL_TEXTURE_BINDING_2D_MULTISAMPLE pname was not recognized by one of the glGet*() functions");

	glw::GLfloat expected_float_value = float(to_id_2d_multisample);

	if (bool_value != GL_TRUE || de::abs(float_value - expected_float_value) > epsilon ||
		(glw::GLuint)int_value != to_id_2d_multisample)
	{
		TCU_FAIL("GL_TEXTURE_BINDING_2D_MULTISAMPLE value is invalid");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		bool_value  = GL_FALSE;
		float_value = 0.0f;
		int_value   = 0;

		gl.getBooleanv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &bool_value);
		gl.getFloatv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &float_value);
		gl.getIntegerv(GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES, &int_value);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES pname was not recognized by one of the glGet*() functions");

		expected_float_value = float(to_id_2d_multisample_array);

		if (bool_value != GL_TRUE || de::abs(float_value - expected_float_value) > epsilon ||
			(glw::GLuint)int_value != to_id_2d_multisample_array)
		{
			TCU_FAIL("GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY_OES value is invalid");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}